

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Aig_Man_t * Abc_NtkToDar(Abc_Ntk_t *pNtk,int fExors,int fRegisters)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p;
  Abc_Obj_t *p1;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  Vec_Int_t *pVVar8;
  Vec_Vec_t *pVVar9;
  ulong uVar10;
  uint local_d0;
  uint local_4c;
  int nDontCares;
  int nNodes;
  int i;
  Abc_Obj_t *pObj;
  Aig_Obj_t *pObjNew;
  Aig_Man_t *pMan;
  Vec_Ptr_t *vNodes;
  int fRegisters_local;
  int fExors_local;
  Abc_Ntk_t *pNtk_local;
  
  if (fRegisters != 0) {
    iVar1 = Abc_NtkBoxNum(pNtk);
    iVar2 = Abc_NtkLatchNum(pNtk);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0xf3,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
    }
    for (nDontCares = 0; iVar1 = Abc_NtkCiNum(pNtk), nDontCares < iVar1; nDontCares = nDontCares + 1
        ) {
      pAVar3 = Abc_NtkCi(pNtk,nDontCares);
      iVar1 = Abc_NtkPiNum(pNtk);
      if (nDontCares < iVar1) {
        iVar1 = Abc_ObjIsPi(pAVar3);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsPi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0xf7,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
        iVar1 = Abc_ObjIsPi(pAVar3);
        if (iVar1 == 0) {
          Abc_Print(1,"Abc_NtkToDar(): Temporary bug: The PI ordering is wrong!\n");
        }
      }
      else {
        iVar1 = Abc_ObjIsBo(pAVar3);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsBo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0xfc,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
      }
    }
    for (nDontCares = 0; iVar1 = Abc_NtkCoNum(pNtk), nDontCares < iVar1; nDontCares = nDontCares + 1
        ) {
      pAVar3 = Abc_NtkCo(pNtk,nDontCares);
      iVar1 = Abc_NtkPoNum(pNtk);
      if (nDontCares < iVar1) {
        iVar1 = Abc_ObjIsPo(pAVar3);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsPo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0x100,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
        iVar1 = Abc_ObjIsPo(pAVar3);
        if (iVar1 == 0) {
          Abc_Print(1,"Abc_NtkToDar(): Temporary bug: The PO ordering is wrong!\n");
        }
      }
      else {
        iVar1 = Abc_ObjIsBi(pAVar3);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsBi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0x105,"Aig_Man_t *Abc_NtkToDar(Abc_Ntk_t *, int, int)");
        }
      }
    }
    local_4c = 0;
    for (nDontCares = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), nDontCares < iVar1;
        nDontCares = nDontCares + 1) {
      pAVar3 = Abc_NtkBox(pNtk,nDontCares);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if ((iVar1 != 0) && (iVar1 = Abc_LatchIsInitDc(pAVar3), iVar1 != 0)) {
        Abc_LatchSetInit0(pAVar3);
        local_4c = local_4c + 1;
      }
    }
    if (local_4c != 0) {
      Abc_Print(1,"Warning: %d registers in this network have don\'t-care init values.\n",
                (ulong)local_4c);
      Abc_Print(1,"The don\'t-care are assumed to be 0. The result may not verify.\n");
      Abc_Print(1,"Use command \"print_latch\" to see the init values of registers.\n");
      Abc_Print(1,"Use command \"zero\" to convert or \"init\" to change the values.\n");
    }
  }
  iVar1 = Abc_NtkNodeNum(pNtk);
  pNtk_local = (Abc_Ntk_t *)Aig_ManStart(iVar1 + 100);
  ((Aig_Man_t *)pNtk_local)->fCatchExor = fExors;
  ((Aig_Man_t *)pNtk_local)->nConstrs = pNtk->nConstrs;
  ((Aig_Man_t *)pNtk_local)->nBarBufs = pNtk->nBarBufs;
  pcVar4 = Extra_UtilStrsav(pNtk->pName);
  ((Aig_Man_t *)pNtk_local)->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
  ((Aig_Man_t *)pNtk_local)->pSpec = pcVar4;
  pAVar3 = (Abc_Obj_t *)Aig_ManConst1((Aig_Man_t *)pNtk_local);
  pAVar5 = Abc_AigConst1(pNtk);
  (pAVar5->field_6).pCopy = pAVar3;
  for (nDontCares = 0; iVar1 = Abc_NtkCiNum(pNtk), nDontCares < iVar1; nDontCares = nDontCares + 1)
  {
    pAVar5 = Abc_NtkCi(pNtk,nDontCares);
    pAVar3 = (Abc_Obj_t *)Aig_ObjCreateCi((Aig_Man_t *)pNtk_local);
    (pAVar5->field_6).pCopy = pAVar3;
    pAVar3 = (pAVar5->field_6).pCopy;
    uVar10._0_4_ = (pAVar3->vFanins).nCap;
    uVar10._4_4_ = (pAVar3->vFanins).nSize;
    uVar10 = uVar10 & 0xff000000ffffffff | (ulong)(*(uint *)&pAVar5->field_0x14 >> 0xc) << 0x20;
    (pAVar3->vFanins).nCap = (int)uVar10;
    (pAVar3->vFanins).nSize = (int)(uVar10 >> 0x20);
  }
  if (fRegisters != 0) {
    for (nDontCares = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), nDontCares < iVar1;
        nDontCares = nDontCares + 1) {
      pAVar3 = Abc_NtkBox(pNtk,nDontCares);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if ((iVar1 != 0) && (iVar1 = Abc_LatchIsInit1(pAVar3), iVar1 != 0)) {
        pAVar5 = Abc_ObjFanout0(pAVar3);
        pAVar5 = Abc_ObjNot((pAVar5->field_6).pCopy);
        pAVar3 = Abc_ObjFanout0(pAVar3);
        (pAVar3->field_6).pCopy = pAVar5;
      }
    }
  }
  p = Abc_NtkDfs(pNtk,0);
  for (nDontCares = 0; iVar1 = Vec_PtrSize(p), nDontCares < iVar1; nDontCares = nDontCares + 1) {
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,nDontCares);
    pAVar5 = Abc_ObjChild0Copy(pAVar3);
    p1 = Abc_ObjChild1Copy(pAVar3);
    pAVar5 = (Abc_Obj_t *)Aig_And((Aig_Man_t *)pNtk_local,(Aig_Obj_t *)pAVar5,(Aig_Obj_t *)p1);
    (pAVar3->field_6).pCopy = pAVar5;
  }
  Vec_PtrFree(p);
  ((Aig_Man_t *)pNtk_local)->fAddStrash = 0;
  for (nDontCares = 0; iVar1 = Abc_NtkCoNum(pNtk), nDontCares < iVar1; nDontCares = nDontCares + 1)
  {
    pAVar3 = Abc_NtkCo(pNtk,nDontCares);
    pAVar3 = Abc_ObjChild0Copy(pAVar3);
    Aig_ObjCreateCo((Aig_Man_t *)pNtk_local,(Aig_Obj_t *)pAVar3);
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  Aig_ManSetRegNum((Aig_Man_t *)pNtk_local,iVar1);
  if (fRegisters != 0) {
    iVar1 = Aig_ManCoNum((Aig_Man_t *)pNtk_local);
    iVar2 = Aig_ManRegNum((Aig_Man_t *)pNtk_local);
    for (nDontCares = iVar1 - iVar2; iVar1 = Vec_PtrSize(((Aig_Man_t *)pNtk_local)->vCos),
        nDontCares < iVar1; nDontCares = nDontCares + 1) {
      pvVar6 = Vec_PtrEntry(((Aig_Man_t *)pNtk_local)->vCos,nDontCares);
      pAVar3 = Abc_NtkCo(pNtk,nDontCares);
      pAVar3 = Abc_ObjFanout0(pAVar3);
      iVar1 = Abc_LatchIsInit1(pAVar3);
      if (iVar1 != 0) {
        pAVar7 = Aig_Not(*(Aig_Obj_t **)((long)pvVar6 + 8));
        *(Aig_Obj_t **)((long)pvVar6 + 8) = pAVar7;
      }
    }
  }
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 == 0) {
    local_d0 = Aig_ManCleanup((Aig_Man_t *)pNtk_local);
  }
  else {
    local_d0 = 0;
  }
  if ((fExors == 0) && (local_d0 != 0)) {
    Abc_Print(1,"Abc_NtkToDar(): Unexpected %d dangling nodes when converting to AIG!\n",
              (ulong)local_d0);
  }
  if (fRegisters != 0) {
    iVar1 = Abc_NtkLatchNum(pNtk);
    Aig_ManSetRegNum((Aig_Man_t *)pNtk_local,iVar1);
    pVVar8 = Vec_IntStartNatural(((Aig_Man_t *)pNtk_local)->nRegs);
    ((Aig_Man_t *)pNtk_local)->vFlopNums = pVVar8;
    if (pNtk->vOnehots != (Vec_Ptr_t *)0x0) {
      pVVar9 = Vec_VecDupInt((Vec_Vec_t *)pNtk->vOnehots);
      ((Aig_Man_t *)pNtk_local)->vOnehots = (Vec_Ptr_t *)pVVar9;
    }
  }
  iVar1 = Aig_ManCheck((Aig_Man_t *)pNtk_local);
  if (iVar1 == 0) {
    Abc_Print(1,"Abc_NtkToDar: AIG check has failed.\n");
    Aig_ManStop((Aig_Man_t *)pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return (Aig_Man_t *)pNtk_local;
}

Assistant:

Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters )
{
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pMan;
    Aig_Obj_t * pObjNew;
    Abc_Obj_t * pObj;
    int i, nNodes, nDontCares;
    // make sure the latches follow PIs/POs
    if ( fRegisters ) 
    { 
        assert( Abc_NtkBoxNum(pNtk) == Abc_NtkLatchNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            if ( i < Abc_NtkPiNum(pNtk) )
            {
                assert( Abc_ObjIsPi(pObj) );
                if ( !Abc_ObjIsPi(pObj) )
                    Abc_Print( 1, "Abc_NtkToDar(): Temporary bug: The PI ordering is wrong!\n" );
            }
            else
                assert( Abc_ObjIsBo(pObj) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            if ( i < Abc_NtkPoNum(pNtk) )
            {
                assert( Abc_ObjIsPo(pObj) );
                if ( !Abc_ObjIsPo(pObj) )
                    Abc_Print( 1, "Abc_NtkToDar(): Temporary bug: The PO ordering is wrong!\n" );
            }
            else
                assert( Abc_ObjIsBi(pObj) );
        // print warning about initial values
        nDontCares = 0;
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Abc_LatchIsInitDc(pObj) )
            {
                Abc_LatchSetInit0(pObj);
                nDontCares++;
            }
        if ( nDontCares )
        {
            Abc_Print( 1, "Warning: %d registers in this network have don't-care init values.\n", nDontCares );
            Abc_Print( 1, "The don't-care are assumed to be 0. The result may not verify.\n" );
            Abc_Print( 1, "Use command \"print_latch\" to see the init values of registers.\n" );
            Abc_Print( 1, "Use command \"zero\" to convert or \"init\" to change the values.\n" );
        }
    }
    // create the manager
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->fCatchExor = fExors;
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
        // initialize logic level of the CIs
        ((Aig_Obj_t *)pObj->pCopy)->Level = pObj->Level;
    }

    // complement the 1-values registers
    if ( fRegisters ) {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Abc_LatchIsInit1(pObj) )
                Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNot(Abc_ObjFanout0(pObj)->pCopy);
    }
    // perform the conversion of the internal nodes (assumes DFS ordering)
//    pMan->fAddStrash = 1;
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
//    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
//        Abc_Print( 1, "%d->%d ", pObj->Id, ((Aig_Obj_t *)pObj->pCopy)->Id );
    }
    Vec_PtrFree( vNodes );
    pMan->fAddStrash = 0;
    // create the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj) );
    // complement the 1-valued registers
    Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
    if ( fRegisters )
        Aig_ManForEachLiSeq( pMan, pObjNew, i )
            if ( Abc_LatchIsInit1(Abc_ObjFanout0(Abc_NtkCo(pNtk,i))) )
                pObjNew->pFanin0 = Aig_Not(pObjNew->pFanin0);
    // remove dangling nodes
    nNodes = (Abc_NtkGetChoiceNum(pNtk) == 0)? Aig_ManCleanup( pMan ) : 0;
    if ( !fExors && nNodes )
        Abc_Print( 1, "Abc_NtkToDar(): Unexpected %d dangling nodes when converting to AIG!\n", nNodes );
//Aig_ManDumpVerilog( pMan, "test.v" );
    // save the number of registers
    if ( fRegisters )
    {
        Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
        pMan->vFlopNums = Vec_IntStartNatural( pMan->nRegs );
//        pMan->vFlopNums = NULL;
//        pMan->vOnehots = Abc_NtkConverLatchNamesIntoNumbers( pNtk );
        if ( pNtk->vOnehots )
            pMan->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    }
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDar: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}